

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O2

Aig_Man_t * generateGeneralDisjunctiveTester(Abc_Ntk_t *pNtk,Aig_Man_t *pAig,int combK)

{
  Aig_Man_t *p;
  size_t sVar1;
  char *__s;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  long lVar4;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  int nCap;
  int iVar6;
  int iVar7;
  long k;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  
  iVar7 = pAig->nRegs;
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar1 = strlen(pAig->pName);
  __s = (char *)malloc(sVar1 + 5);
  p->pName = __s;
  sprintf(__s,"%s_%s",pAig->pName,"nCk");
  p->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  for (iVar10 = 0; iVar10 < pAig->nTruePis; iVar10 = iVar10 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,iVar10);
    pAVar3 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  for (iVar10 = 0; iVar10 < pAig->nRegs; iVar10 = iVar10 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar10);
    pAVar3 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  uVar11 = 0;
  uVar9 = (ulong)(uint)combK;
  if (combK < 1) {
    uVar9 = uVar11;
  }
  for (k = 1; k - uVar9 != 1; k = k + 1) {
    lVar4 = countCombination((long)iVar7,k);
    uVar11 = uVar11 + lVar4;
  }
  if ((long)uVar11 < 1) {
    __assert_fail("lCombinationCount > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/combination.c"
                  ,0x181,
                  "Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)");
  }
  nCap = (int)uVar11;
  p_00 = Vec_PtrAlloc(nCap);
  uVar8 = uVar11;
  while (bVar12 = uVar8 != 0, uVar8 = uVar8 - 1, bVar12) {
    pAVar3 = Aig_ObjCreateCi(p);
    Vec_PtrPush(p_00,pAVar3);
  }
  for (iVar6 = 0; iVar6 < pAig->vObjs->nSize; iVar6 = iVar6 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar6);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
      pAVar5 = Aig_ObjChild0Copy(pAVar3);
      p1 = Aig_ObjChild1Copy(pAVar3);
      pAVar5 = Aig_And(p,pAVar5,p1);
      (pAVar3->field_5).pData = pAVar5;
    }
  }
  p_01 = Vec_PtrAlloc(nCap);
  for (iVar6 = 1; iVar6 - (int)uVar9 != 1; iVar6 = iVar6 + 1) {
    generateCombinatorialStabilExhaust(p,pAig,p_01,iVar7,iVar6);
  }
  p_02 = Vec_PtrAlloc(nCap);
  for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,(int)uVar9);
    pvVar2 = Vec_PtrEntry(p_01,(int)uVar9);
    pAVar3 = Aig_Or(p,(Aig_Obj_t *)((ulong)pvVar2 ^ 1),pAVar3);
    Vec_PtrPush(p_02,pAVar3);
  }
  for (iVar7 = 0; iVar7 < pAig->nTruePos; iVar7 = iVar7 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar7);
    pAVar5 = Aig_ObjChild0Copy(pAVar3);
    pAVar5 = Aig_ObjCreateCo(p,pAVar5);
    (pAVar3->field_5).pData = pAVar5;
  }
  for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_02,(int)uVar9);
    Aig_ObjCreateCo(p,pAVar3);
  }
  for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar7);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    Aig_ObjCreateCo(p,pAVar3);
  }
  for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_02,(int)uVar9);
    Aig_ObjCreateCo(p,pAVar3);
  }
  if (iVar10 == iVar7) {
    Aig_ManSetRegNum(p,iVar7 + nCap);
    Aig_ManCleanup(p);
    iVar7 = Aig_ManCheck(p);
    if (iVar7 != 0) {
      Vec_PtrFree(p_00);
      Vec_PtrFree(p_02);
      Vec_PtrFree(p_01);
      return p;
    }
    __assert_fail("Aig_ManCheck( pNewAig )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/combination.c"
                  ,0x1c6,
                  "Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)");
  }
  __assert_fail("liCopied + liCreated == loCopied + loCreated",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/combination.c"
                ,0x1c1,"Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)")
  ;
}

Assistant:

Aig_Man_t *generateGeneralDisjunctiveTester( Abc_Ntk_t *pNtk, Aig_Man_t *pAig, int combK )
{
	//AIG creation related data structure
	Aig_Man_t *pNewAig;
	int piCopied = 0, loCopied = 0, loCreated = 0, liCopied = 0, liCreated = 0, poCopied = 0;
	//int i, iElem, nRegCount, hintSingalBeginningMarker, hintSingalEndMarker;
	int i, nRegCount;
	int combN_internal, combK_internal; //, targetPoIndex;
	long longI, lCombinationCount;
	//Aig_Obj_t *pObj, *pObjMonoCand, *pObjLO_nCk, *pObjDisj_nCk;
	Aig_Obj_t *pObj, *pObjLO_nCk, *pObjDisj_nCk;
	Vec_Ptr_t *vLO_nCk, *vPODriver_nCk, *vDisj_nCk;

	extern Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk);
	
	//Knuth's Data Strcuture
	//Vec_Int_t *vC_KNUTH;
	//int i_KNUTH, j_KNUTH, combCounter_KNUTH = 0;

	//Collecting target HINT signals
	//vCandidateMonotoneSignals = findHintOutputs(pNtk);
	//if( vCandidateMonotoneSignals == NULL )
	//{
	//	printf("\nTraget Signal Set is Empty: Duplicating given AIG\n");
	//	combN_internal = 0;
	//}
	//else
	//{
		//Vec_IntForEachEntry( vCandidateMonotoneSignals, iElem, i )
		//	printf("Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
	//	hintSingalBeginningMarker = Vec_IntEntry( vCandidateMonotoneSignals, 0 );
	//	hintSingalEndMarker = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntSize(vCandidateMonotoneSignals) - 1 );
	//	combN_internal = hintSingalEndMarker - hintSingalBeginningMarker + 1;
	//}

	combN_internal = Aig_ManRegNum(pAig);

	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_nCk") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "nCk");
    	pNewAig->pSpec = NULL;

	//Standard Mapping of Constant Nodes
	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//Standard AIG PI duplication
	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//Standard AIG LO duplication
	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//nCk LO creation
	lCombinationCount = 0;
	for(combK_internal=1; combK_internal<=combK; combK_internal++)
		lCombinationCount += countCombination( combN_internal, combK_internal );
	assert( lCombinationCount > 0 );
	vLO_nCk = Vec_PtrAlloc(lCombinationCount);
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		loCreated++;
		pObj = Aig_ObjCreateCi(pNewAig);
		Vec_PtrPush( vLO_nCk, pObj );
	}

	//Standard Node duplication
	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//nCk specific logic creation (i.e. nCk number of OR gates)
	vDisj_nCk = Vec_PtrAlloc(lCombinationCount);

	for( combK_internal=1; combK_internal<=combK; combK_internal++ )
	{
		generateCombinatorialStabilExhaust( pNewAig, pAig,
				vDisj_nCk, combN_internal, combK_internal );
	}


	//creation of implication logic
	vPODriver_nCk = Vec_PtrAlloc(lCombinationCount);
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		pObjLO_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vLO_nCk, longI ));
		pObjDisj_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vDisj_nCk, longI ));

		pObj = Aig_Or( pNewAig, Aig_Not(pObjDisj_nCk), pObjLO_nCk);
		Vec_PtrPush(vPODriver_nCk, pObj);
	}
	
	//Standard PO duplication
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	//nCk specific PO creation
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
	}

	//Standard LI duplication
	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	//nCk specific LI creation
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
	}

	//clean-up, book-keeping
	assert( liCopied + liCreated == loCopied + loCreated );	
	nRegCount = loCopied + loCreated;

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	assert( Aig_ManCheck( pNewAig ) );
	
	Vec_PtrFree(vLO_nCk);
	Vec_PtrFree(vPODriver_nCk);
	Vec_PtrFree(vDisj_nCk);
	//Vec_IntFree(vC_KNUTH);	
	return pNewAig;
}